

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCursor(Btree *p,Pgno iTable,int wrFlag,KeyInfo *pKeyInfo,BtCursor *pCur)

{
  int iVar1;
  BtCursor *in_RCX;
  int in_EDX;
  Pgno in_ESI;
  Btree *in_RDI;
  BtCursor *in_R8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->sharable == '\0') {
    iVar1 = btreeCursor((Btree *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (Pgno)((ulong)in_RDI >> 0x20),(int)in_RDI,(KeyInfo *)CONCAT44(in_ESI,in_EDX)
                        ,in_RCX);
  }
  else {
    iVar1 = btreeCursorWithLock(in_RDI,in_ESI,in_EDX,(KeyInfo *)in_RCX,in_R8);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCursor(
  Btree *p,                                   /* The btree */
  Pgno iTable,                                /* Root page of table to open */
  int wrFlag,                                 /* 1 to write. 0 read-only */
  struct KeyInfo *pKeyInfo,                   /* First arg to xCompare() */
  BtCursor *pCur                              /* Write new cursor here */
){
  if( p->sharable ){
    return btreeCursorWithLock(p, iTable, wrFlag, pKeyInfo, pCur);
  }else{
    return btreeCursor(p, iTable, wrFlag, pKeyInfo, pCur);
  }
}